

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueList::read(PLYValueList *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong uVar2;
  PLYValue *pPVar3;
  undefined4 in_register_00000034;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  
  (*this->size->_vptr_PLYValue[2])();
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  uVar2 = (long)(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar2 < uVar1) {
    this->used = uVar2;
    uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
    std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::resize(&this->list,(ulong)uVar1)
    ;
    for (sVar4 = this->used;
        sVar4 < (ulong)((long)(this->list).
                              super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->list).
                              super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); sVar4 = sVar4 + 1) {
      pPVar3 = createValue(this->tvalue,this->enc);
      (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] = pPVar3;
    }
  }
  uVar1 = (*this->size->_vptr_PLYValue[5])(this->size,0);
  uVar2 = (ulong)uVar1;
  this->used = uVar2;
  for (uVar5 = 0; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    pPVar3 = (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5];
    (*pPVar3->_vptr_PLYValue[2])(pPVar3,CONCAT44(in_register_00000034,__fd));
    uVar2 = this->used;
  }
  return uVar2;
}

Assistant:

void read(std::streambuf *in)
    {
      size->read(in);

      if (size->getUnsignedInt() > list.size())
      {
        used=list.size();
        list.resize(size->getUnsignedInt());

        for (size_t i=used; i<list.size(); i++)
        {
          list[i]=createValue(tvalue, enc);
        }
      }

      used=size->getUnsignedInt();

      for (size_t i=0; i<used; i++)
      {
        list[i]->read(in);
      }
    }